

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_tattle(REF_GRID ref_grid,REF_INT node)

{
  REF_GEOM ref_geom;
  uint uVar1;
  long lVar2;
  
  ref_geom = ref_grid->geom;
  uVar1 = ref_node_location(ref_grid->node,node);
  if (uVar1 == 0) {
    uVar1 = ref_geom_tattle(ref_geom,node);
    if (uVar1 == 0) {
      lVar2 = 0;
      do {
        uVar1 = ref_cell_tattle_about(ref_grid->cell[lVar2],node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x113,"ref_grid_tattle",(ulong)uVar1,"cell tatt");
          return uVar1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x111,
             "ref_grid_tattle",(ulong)uVar1,"geom tatt");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x110,
           "ref_grid_tattle",(ulong)uVar1,"loc");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  RSS(ref_node_location(ref_node, node), "loc");
  RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
  }
  return REF_SUCCESS;
}